

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QList<QPersistentModelIndexData_*>_>::eraseLast
          (QGenericArrayOps<QList<QPersistentModelIndexData_*>_> *this)

{
  qsizetype *pqVar1;
  
  QArrayDataPointer<QPersistentModelIndexData_*>::~QArrayDataPointer
            (&(this->super_QArrayDataPointer<QList<QPersistentModelIndexData_*>_>).ptr
              [(this->super_QArrayDataPointer<QList<QPersistentModelIndexData_*>_>).size + -1].d);
  pqVar1 = &(this->super_QArrayDataPointer<QList<QPersistentModelIndexData_*>_>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }